

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int archive_write_set_format_mtree_default(archive *_a,char *fn)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,fn);
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)&_a[2].file_count != (code *)0x0) {
      (**(code **)&_a[2].file_count)(_a);
    }
    puVar2 = (undefined8 *)calloc(1,0x100);
    if (puVar2 == (undefined8 *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate mtree data");
    }
    else {
      iVar3 = 0;
      *puVar2 = 0;
      *(undefined4 *)(puVar2 + 0xe) = 1;
      puVar2[0x10] = 0;
      puVar2[0x11] = 0;
      puVar2[0x12] = 0;
      puVar2[0x13] = 0;
      puVar2[0x14] = 0;
      puVar2[0x15] = 0;
      puVar2[0x16] = 0;
      puVar2[0x1e] = 0x3d863a;
      *(undefined4 *)(puVar2 + 0x1f) = 0;
      puVar2[6] = 0;
      puVar2[8] = 0;
      puVar2[9] = 0;
      puVar2[10] = 0;
      puVar2[0xb] = 0;
      puVar2[0xc] = 0;
      puVar2[0xd] = 0;
      puVar2[7] = puVar2 + 6;
      *(undefined8 **)&_a[1].current_codepage = puVar2;
      *(code **)&_a[2].file_count = archive_write_mtree_free;
      _a[1].sconv = (archive_string_conv *)0x16b6fd;
      _a[2].vtable = (archive_vtable_conflict *)archive_write_mtree_options;
      _a[2].archive_format_name = (char *)archive_write_mtree_header;
      _a[2].compression_name = (char *)archive_write_mtree_close;
      *(code **)&_a[2].compression_code = archive_write_mtree_data;
      *(code **)&_a[2].archive_format = archive_write_mtree_finish_entry;
      _a->archive_format = 0x80000;
      _a->archive_format_name = "mtree";
    }
  }
  return iVar3;
}

Assistant:

static int
archive_write_set_format_mtree_default(struct archive *_a, const char *fn)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct mtree_writer *mtree;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW, fn);

	if (a->format_free != NULL)
		(a->format_free)(a);

	if ((mtree = calloc(1, sizeof(*mtree))) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate mtree data");
		return (ARCHIVE_FATAL);
	}

	mtree->mtree_entry = NULL;
	mtree->first = 1;
	memset(&(mtree->set), 0, sizeof(mtree->set));
	mtree->keys = DEFAULT_KEYS;
	mtree->dironly = 0;
	mtree->indent = 0;
	archive_string_init(&mtree->ebuf);
	archive_string_init(&mtree->buf);
	mtree_entry_register_init(mtree);
	a->format_data = mtree;
	a->format_free = archive_write_mtree_free;
	a->format_name = "mtree";
	a->format_options = archive_write_mtree_options;
	a->format_write_header = archive_write_mtree_header;
	a->format_close = archive_write_mtree_close;
	a->format_write_data = archive_write_mtree_data;
	a->format_finish_entry = archive_write_mtree_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_MTREE;
	a->archive.archive_format_name = "mtree";

	return (ARCHIVE_OK);
}